

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeTarget
          (DeferredThirdPartyClient *this,Builder target)

{
  Builder target_00;
  RpcConnectionState *cap;
  DeferredThirdPartyClient *in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar1;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  DeferredThirdPartyClient *this_local;
  
  this_local = this;
  cap = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                  (&(in_RSI->super_RpcClient).connectionState);
  ensureAccepted(in_RSI);
  memcpy(&local_40,&target,0x28);
  target_00._builder.capTable = (CapTableBuilder *)uStack_38;
  target_00._builder.segment = (SegmentBuilder *)local_40;
  target_00._builder.data = (void *)local_30;
  target_00._builder.pointers = (WirePointer *)uStack_28;
  target_00._builder.dataSize = (undefined4)local_20;
  target_00._builder.pointerCount = local_20._4_2_;
  target_00._builder._38_2_ = local_20._6_2_;
  MVar1 = RpcConnectionState::writeTarget((RpcConnectionState *)this,(ClientHook *)cap,target_00);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      // Someone is addressing a message to this capability. We probably need to accept it and
      // have them address the accepted capability instead.
      return connectionState->writeTarget(ensureAccepted(), target);
    }